

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

matches * tabdesc(disctx *ctx,match m,atom *atoms)

{
  int iVar1;
  match a;
  matches *__ptr;
  match *pmVar2;
  long lVar3;
  matches *pmVar4;
  matches *pmVar5;
  long lVar6;
  long *in_RSI;
  undefined8 *puVar7;
  undefined8 in_RDI;
  undefined8 *puVar8;
  byte bVar9;
  undefined1 in_stack_00000000 [184];
  matches *tmp;
  int i;
  matches *res;
  matches *ms;
  matches *res_1;
  matches *in_stack_fffffffffffffee8;
  matches *in_stack_fffffffffffffef0;
  matches *in_stack_ffffffffffffffc0;
  int local_34;
  undefined8 in_stack_ffffffffffffffd0;
  atom *in_stack_ffffffffffffffe0;
  disctx *ctx_00;
  undefined8 in_stack_fffffffffffffff8;
  
  bVar9 = 0;
  if (*in_RSI == 0) {
    __ptr = emptymatches();
    if (__ptr->mmax <= __ptr->mnum) {
      if (__ptr->mmax == 0) {
        __ptr->mmax = 0x10;
      }
      else {
        __ptr->mmax = __ptr->mmax << 1;
      }
      pmVar2 = (match *)realloc(__ptr->m,(long)__ptr->mmax * 0xb8);
      __ptr->m = pmVar2;
    }
    iVar1 = __ptr->mnum;
    __ptr->mnum = iVar1 + 1;
    memcpy(__ptr->m + iVar1,&stack0x00000008,0xb8);
  }
  else {
    lVar3 = (*(code *)*in_RSI)(in_RDI,0,0,in_RSI[1],in_stack_00000000._48_4_);
    if (lVar3 == 0) {
      __ptr = (matches *)0x0;
    }
    else {
      puVar7 = (undefined8 *)&stack0x00000008;
      puVar8 = (undefined8 *)&stack0xfffffffffffffee8;
      for (lVar6 = 0x17; lVar6 != 0; lVar6 = lVar6 + -1) {
        *puVar8 = *puVar7;
        puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
        puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
      }
      a.a[0] = lVar3;
      a._0_8_ = in_stack_ffffffffffffffd0;
      a.a[1] = (ull)in_stack_ffffffffffffffe0;
      a.m[0] = (ull)in_RSI;
      a.m[1] = in_RDI;
      a._40_8_ = in_stack_fffffffffffffff8;
      unique0x100002fb = in_stack_00000000;
      __ptr = mergematches(a,in_stack_ffffffffffffffc0);
      ctx_00 = (disctx *)(in_RSI + 2);
      if (ctx_00->isa != (disisa *)0x0) {
        pmVar4 = emptymatches();
        for (local_34 = 0; in_stack_00000000 = in_stack_00000000._0_136_, local_34 < __ptr->mnum;
            local_34 = local_34 + 1) {
          pmVar2 = __ptr->m + local_34;
          puVar7 = (undefined8 *)&stack0xfffffffffffffee8;
          for (lVar3 = 0x17; lVar3 != 0; lVar3 = lVar3 + -1) {
            *puVar7 = *(undefined8 *)pmVar2;
            pmVar2 = (match *)((long)pmVar2 + ((ulong)bVar9 * -2 + 1) * 8);
            puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
          }
          pmVar5 = tabdesc(ctx_00,(undefined1  [136])in_stack_00000000,in_stack_ffffffffffffffe0);
          if (pmVar5 != (matches *)0x0) {
            pmVar4 = catmatches(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
          }
        }
        free(__ptr->m);
        free(__ptr);
        __ptr = pmVar4;
      }
    }
  }
  return __ptr;
}

Assistant:

struct matches *tabdesc (struct disctx *ctx, struct match m, const struct atom *atoms) {
	if (!atoms->fun) {
		struct matches *res = emptymatches();
		ADDARRAY(res->m, m);
		return res;
	}
	struct matches *ms = atoms->fun(ctx, 0, 0, atoms->arg, m.lpos);
	if (!ms)
		return 0;
	ms = mergematches(m, ms);
	atoms++;
	if (!atoms->fun)
		return ms;
	struct matches *res = emptymatches();
	int i;
	for (i = 0; i < ms->mnum; i++) {
		struct matches *tmp = tabdesc(ctx, ms->m[i], atoms);
		if (tmp)
			res = catmatches(res, tmp);
	}
	free(ms->m);
	free(ms);
	return res;
}